

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_send(nghttp2_session *session)

{
  nghttp2_buf_chain *pnVar1;
  ssize_t sVar2;
  long lVar3;
  nghttp2_bufs *framebufs;
  ssize_t sentlen;
  ssize_t datalen;
  uint8_t *data;
  nghttp2_session *session_local;
  
  datalen = 0;
  data = (uint8_t *)session;
  while( true ) {
    sVar2 = nghttp2_session_mem_send_internal((nghttp2_session *)data,(uint8_t **)&datalen,0);
    if (sVar2 < 1) {
      return (int)sVar2;
    }
    lVar3 = (**(code **)(data + 0x928))(data,datalen,sVar2,0,*(undefined8 *)(data + 0xa08));
    if (lVar3 < 0) break;
    pnVar1 = (session->aob).framebufs.cur;
    (pnVar1->buf).pos = (pnVar1->buf).pos + -(sVar2 - lVar3);
  }
  if (lVar3 == -0x1f8) {
    pnVar1 = (session->aob).framebufs.cur;
    (pnVar1->buf).pos = (pnVar1->buf).pos + -sVar2;
    return 0;
  }
  return -0x386;
}

Assistant:

int nghttp2_session_send(nghttp2_session *session) {
  const uint8_t *data = NULL;
  ssize_t datalen;
  ssize_t sentlen;
  nghttp2_bufs *framebufs;

  framebufs = &session->aob.framebufs;

  for (;;) {
    datalen = nghttp2_session_mem_send_internal(session, &data, 0);
    if (datalen <= 0) {
      return (int)datalen;
    }
    sentlen = session->callbacks.send_callback(session, data, (size_t)datalen,
                                               0, session->user_data);
    if (sentlen < 0) {
      if (sentlen == NGHTTP2_ERR_WOULDBLOCK) {
        /* Transmission canceled. Rewind the offset */
        framebufs->cur->buf.pos -= datalen;

        return 0;
      }
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
    /* Rewind the offset to the amount of unsent bytes */
    framebufs->cur->buf.pos -= datalen - sentlen;
  }
}